

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_frame_write(lws *wsi,int type,int flags,uint sid,uint len,uchar *buf)

{
  lws *wsi_00;
  uint uVar1;
  int32_t iVar2;
  int32_t iVar3;
  int n;
  uchar *p;
  lws *nwsi;
  uchar *buf_local;
  uint len_local;
  uint sid_local;
  int flags_local;
  int type_local;
  lws *wsi_local;
  
  wsi_00 = lws_get_network_wsi(wsi);
  buf[-9] = (uchar)(len >> 0x10);
  buf[-8] = (uchar)(len >> 8);
  buf[-7] = (uchar)len;
  buf[-6] = (uchar)type;
  buf[-5] = (uchar)flags;
  buf[-4] = (uchar)(sid >> 0x18);
  buf[-3] = (uchar)(sid >> 0x10);
  buf[-2] = (uchar)(sid >> 8);
  buf[-1] = (uchar)sid;
  iVar2 = (wsi->txc).tx_cr;
  iVar3 = (wsi_00->txc).tx_cr;
  uVar1 = len;
  _lws_log(0x10,"%s: %p (eff %p). typ %d, fl 0x%x, sid=%d, len=%d, txcr=%d, nwsi->txcr=%d\n",
           "lws_h2_frame_write",wsi,wsi_00,(ulong)(uint)type,flags,sid,len,iVar2,iVar3);
  if (type == 0) {
    if ((wsi->txc).tx_cr < (int)len) {
      _lws_log(8,"%s: %p: sending payload len %d but tx_cr only %d!\n","lws_h2_frame_write",wsi,
               (ulong)len,(ulong)(uint)(wsi->txc).tx_cr,flags,sid,uVar1,iVar2,iVar3);
    }
    lws_h2_tx_cr_consume(wsi,len);
  }
  wsi_local._4_4_ = lws_issue_raw(wsi_00,buf + -9,(ulong)(len + 9));
  if ((-1 < wsi_local._4_4_) && (8 < wsi_local._4_4_)) {
    wsi_local._4_4_ = wsi_local._4_4_ + -9;
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_h2_frame_write(struct lws *wsi, int type, int flags,
		       unsigned int sid, unsigned int len, unsigned char *buf)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	unsigned char *p = &buf[-LWS_H2_FRAME_HEADER_LENGTH];
	int n;

	//if (wsi->h2_stream_carries_ws)
	// lwsl_hexdump_level(LLL_NOTICE, buf, len);

	*p++ = len >> 16;
	*p++ = len >> 8;
	*p++ = len;
	*p++ = type;
	*p++ = flags;
	*p++ = sid >> 24;
	*p++ = sid >> 16;
	*p++ = sid >> 8;
	*p++ = sid;

	lwsl_debug("%s: %p (eff %p). typ %d, fl 0x%x, sid=%d, len=%d, "
		   "txcr=%d, nwsi->txcr=%d\n", __func__, wsi, nwsi, type, flags,
		   sid, len, (int)wsi->txc.tx_cr, (int)nwsi->txc.tx_cr);

	if (type == LWS_H2_FRAME_TYPE_DATA) {
		if (wsi->txc.tx_cr < (int)len)
			lwsl_info("%s: %p: sending payload len %d"
				 " but tx_cr only %d!\n", __func__, wsi,
				 len, (int)wsi->txc.tx_cr);
		lws_h2_tx_cr_consume(wsi, len);
	}

	n = lws_issue_raw(nwsi, &buf[-LWS_H2_FRAME_HEADER_LENGTH],
			  len + LWS_H2_FRAME_HEADER_LENGTH);
	if (n < 0)
		return n;

	if (n >= LWS_H2_FRAME_HEADER_LENGTH)
		return n - LWS_H2_FRAME_HEADER_LENGTH;

	return n;
}